

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O3

intrusive_ptr<booster::details::key> __thiscall
booster::details::make_key(details *this,_func_void_void_ptr *dtor)

{
  pthread_key *this_00;
  
  this_00 = (pthread_key *)operator_new(0x20);
  pthread_key::pthread_key(this_00,dtor);
  *(pthread_key **)this = this_00;
  atomic_counter::inc(&(this_00->super_key).super_refcounted.refs_);
  return (intrusive_ptr<booster::details::key>)(key *)this;
}

Assistant:

intrusive_ptr<key> make_key(void (*dtor)(void *))
		{
			return new pthread_key(dtor);
		}